

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isValidServerBasedAuthority
               (XMLCh *host,XMLSize_t hostLen,int port,XMLCh *userinfo,XMLSize_t userLen)

{
  XMLCh theChar;
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  
  bVar1 = isWellFormedAddress(host,hostLen);
  bVar3 = false;
  if (((port + 1U < 0x10001) && (bVar1)) && (bVar3 = true, userLen != 0)) {
    uVar5 = 0;
    do {
      theChar = userinfo[uVar5];
      bVar1 = XMLString::isAlphaNum(theChar);
      lVar4 = 1;
      if (((!bVar1) && (iVar2 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar2 == -1))
         && (iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,userinfo[uVar5]), iVar2 == -1))
      {
        if (((userinfo[uVar5] != L'%') || (userLen <= uVar5 + 2)) ||
           (bVar1 = XMLString::isHex(userinfo[uVar5 + 1]), !bVar1)) {
          return false;
        }
        bVar1 = XMLString::isHex(userinfo[uVar5 + 2]);
        lVar4 = 3;
        if (!bVar1) {
          return false;
        }
      }
      uVar5 = uVar5 + lVar4;
    } while (uVar5 < userLen);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool XMLUri::isValidServerBasedAuthority(const XMLCh* const host,
                                         const XMLSize_t hostLen,
                                         const int port,
                                         const XMLCh* const userinfo,
                                         const XMLSize_t userLen)
{
    // The order is important, do not change
    if (!isWellFormedAddress(host, hostLen))
        return false;

    // check port number
    if ((port > 65535) || (port < 0 && port != -1))
        return false;

    // check userinfo
    XMLSize_t index = 0;
    while (index < userLen)
    {
        if (isUnreservedCharacter(userinfo[index]) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, userinfo[index]) != -1))
        {
            index++;
        }
        else if (userinfo[index] == chPercent)               // '%'
        {
            if (index + 2 < userLen
                && XMLString::isHex(userinfo[index+1])       // 1st hex
                && XMLString::isHex(userinfo[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}